

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

void __thiscall
QNetworkAccessManager::setCache(QNetworkAccessManager *this,QAbstractNetworkCache *cache)

{
  long lVar1;
  QAbstractNetworkCache *pQVar2;
  
  lVar1 = *(long *)(this + 8);
  pQVar2 = *(QAbstractNetworkCache **)(lVar1 + 0x78);
  if (pQVar2 != cache) {
    if (pQVar2 != (QAbstractNetworkCache *)0x0) {
      (**(code **)(*(long *)pQVar2 + 0x20))();
    }
    *(QAbstractNetworkCache **)(lVar1 + 0x78) = cache;
    if (cache != (QAbstractNetworkCache *)0x0) {
      QObject::setParent(&cache->super_QObject);
      return;
    }
  }
  return;
}

Assistant:

void QNetworkAccessManager::setCache(QAbstractNetworkCache *cache)
{
    Q_D(QNetworkAccessManager);
    if (d->networkCache != cache) {
        delete d->networkCache;
        d->networkCache = cache;
        if (d->networkCache)
            d->networkCache->setParent(this);
    }
}